

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O3

void __thiscall
OpenMD::Utils::
AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>::
writeData(AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>
          *this,ostream *stream,string *errorMessage,DataHandling dataHandling)

{
  void *pvVar1;
  pointer pdVar2;
  vector<double,_std::allocator<double>_> *__x;
  void *pvVar3;
  int i;
  ulong uVar4;
  pointer local_68;
  vector<double,_std::allocator<double>_> local_58;
  size_t local_40;
  string *local_38;
  
  local_40 = (this->super_StdVectorAccumulator).Count_;
  local_38 = errorMessage;
  switch(dataHandling) {
  case Average:
    __x = &(this->super_StdVectorAccumulator).Avg_;
    break;
  case Last:
    __x = &(this->super_StdVectorAccumulator).Val_;
    break;
  case Max:
  case Min:
    memcpy(&painCave,"Max and Min functions are not defined for a std::vector Accumulator.",0x45);
    painCave.isFatal = 1;
    simError();
  default:
    pvVar3 = (void *)0x0;
    local_68 = (pointer)0x0;
    goto LAB_0016ff96;
  case Total:
    __x = &(this->super_StdVectorAccumulator).Total_;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_58,__x);
  pvVar3 = (void *)CONCAT71(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  local_68 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
LAB_0016ff96:
  uVar4 = 0;
  while( true ) {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_58,&(this->super_StdVectorAccumulator).Avg_);
    pdVar2 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pvVar1 = (void *)CONCAT71(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start._1_7_,
                              local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start._0_1_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1)
      ;
    }
    if ((ulong)((long)pdVar2 - (long)pvVar1 >> 3) <= uVar4) break;
    if ((*(ulong *)((long)pvVar3 + uVar4 * 8) & 0x7fffffffffffffff) < 0x7ff0000000000000) {
      if (local_40 == 0) {
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start._0_1_ = 9;
        std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
      }
      else {
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start._0_1_ = 9;
        std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
        std::ostream::_M_insert<double>(*(double *)((long)pvVar3 + uVar4 * 8));
      }
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(local_38->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    uVar4 = uVar4 + 1;
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_68 - (long)pvVar3);
  }
  return;
}

Assistant:

void writeData(std::ostream& stream, const std::string& errorMessage,
                   DataHandling dataHandling) const override {
      std::vector<RealType> dat;
      std::size_t count = StdVectorAccumulator::getCount();

      switch (dataHandling) {
      case DataHandling::Average:
        dat = StdVectorAccumulator::getAverage();
        break;
      case DataHandling::Last:
        dat = StdVectorAccumulator::getLastValue();
        break;
      case DataHandling::Total:
        dat = StdVectorAccumulator::getTotal();
        break;
      case DataHandling::Max:
      case DataHandling::Min:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Max and Min functions are not defined for a "
                 "std::vector Accumulator.");
        painCave.isFatal = 1;
        simError();
        break;
      default:
        break;
      }

      for (int i = 0; i < StdVectorAccumulator::getAverage().size(); i++) {
        if (std::isinf(dat[i]) || std::isnan(dat[i])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << '\t';
          else
            stream << '\t' << dat[i];
        }
      }
    }